

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

int cmime_part_from_file(CMimePart_T **part,char *filename,char *nl)

{
  __syscall_slong_t _Var1;
  int iVar2;
  CMimeInfo_T *mi_00;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  CMimeInfo_T *mi;
  char *ptemp;
  uchar local_df [3];
  undefined1 uStack_dc;
  uchar out [4];
  uchar in [3];
  int pos;
  int blocksout;
  int len;
  int i;
  int encode;
  FILE *fp;
  undefined1 local_b8 [4];
  int retval;
  stat fileinfo;
  char *nl_local;
  char *filename_local;
  CMimePart_T **part_local;
  
  stack0xffffffffffffff28 = 0;
  _uStack_dc = 0;
  mi = (CMimeInfo_T *)0x0;
  fileinfo.__glibc_reserved[2] = (__syscall_slong_t)nl;
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xea,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xeb,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  iVar2 = stat(filename,(stat *)local_b8);
  if (iVar2 == 0) {
    if (((uint)fileinfo.st_nlink & 0xf000) == 0x8000) {
      if (fileinfo.__glibc_reserved[2] == 0) {
        fileinfo.__glibc_reserved[2] =
             (__syscall_slong_t)_cmime_internal_determine_linebreak_from_file(filename);
      }
      mi_00 = cmime_util_info_get_from_file(filename);
      iVar2 = strcmp(mi_00->mime_encoding,"binary");
      _Var1 = fileinfo.__glibc_reserved[2];
      if (iVar2 == 0) {
        pcVar4 = mi_00->mime_type;
        pcVar3 = __xpg_basename(filename);
        asprintf((char **)&mi,"%s;%s\tname=%s%s",pcVar4,_Var1,pcVar3,fileinfo.__glibc_reserved[2]);
      }
      else {
        asprintf((char **)&mi,"%s;%s\tcharset=%s%s",mi_00->mime_type,fileinfo.__glibc_reserved[2],
                 mi_00->mime_encoding,fileinfo.__glibc_reserved[2]);
      }
      cmime_util_info_free(mi_00);
      cmime_part_set_content_type(*part,(char *)mi);
      iVar2 = strncmp((char *)mi,"text/plain",10);
      bVar7 = iVar2 != 0;
      if (bVar7) {
        free(mi);
        asprintf((char **)&mi,"base64%s",fileinfo.__glibc_reserved[2]);
      }
      else {
        pcVar4 = strstr((char *)mi,"ascii");
        if (pcVar4 == (char *)0x0) {
          free(mi);
          asprintf((char **)&mi,"8bit%s",fileinfo.__glibc_reserved[2]);
        }
        else {
          free(mi);
          asprintf((char **)&mi,"7bit%s",fileinfo.__glibc_reserved[2]);
        }
      }
      cmime_part_set_content_transfer_encoding(*part,(char *)mi);
      free(mi);
      _Var1 = fileinfo.__glibc_reserved[2];
      pcVar4 = __xpg_basename(filename);
      asprintf((char **)&mi,"attachment;%s\tfilename=%s%s",_Var1,pcVar4,fileinfo.__glibc_reserved[2]
              );
      cmime_part_set_content_disposition(*part,(char *)mi);
      free(mi);
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        perror("libcmime: error opening file");
        part_local._4_4_ = -3;
      }
      else {
        pcVar4 = (char *)calloc(1,1);
        (*part)->content = pcVar4;
        while (iVar2 = feof(__stream), iVar2 == 0) {
          pos = 0;
          for (blocksout = 0; blocksout < 3; blocksout = blocksout + 1) {
            iVar2 = fgetc(__stream);
            local_df[blocksout] = (uchar)iVar2;
            iVar2 = feof(__stream);
            if (iVar2 == 0) {
              pos = pos + 1;
            }
            else {
              local_df[blocksout] = '\0';
            }
          }
          if (pos != 0) {
            if (bVar7) {
              cmime_base64_encode_block(local_df,(uchar *)((long)&ptemp + 5),pos);
              pcVar4 = (*part)->content;
              sVar5 = strlen((*part)->content);
              pcVar4 = (char *)realloc(pcVar4,sVar5 + 6);
              (*part)->content = pcVar4;
              for (blocksout = 0; iVar2 = _uStack_dc, blocksout < 4; blocksout = blocksout + 1) {
                _uStack_dc = _uStack_dc + 1;
                (*part)->content[iVar2] = *(char *)((long)&ptemp + (long)blocksout + 5);
              }
              (*part)->content[_uStack_dc] = '\0';
            }
            else {
              pcVar4 = (*part)->content;
              sVar5 = strlen((*part)->content);
              pcVar4 = (char *)realloc(pcVar4,sVar5 + 5);
              (*part)->content = pcVar4;
              for (blocksout = 0; iVar2 = _uStack_dc, blocksout < 3; blocksout = blocksout + 1) {
                _uStack_dc = _uStack_dc + 1;
                (*part)->content[iVar2] = local_df[blocksout];
              }
              (*part)->content[_uStack_dc] = '\0';
            }
            register0x00000000 = stack0xffffffffffffff28 + 1;
          }
          if ((0x11 < stack0xffffffffffffff28) || (iVar2 = feof(__stream), iVar2 != 0)) {
            if ((stack0xffffffffffffff28 != 0) && (bVar7)) {
              pcVar4 = (*part)->content;
              sVar5 = strlen((*part)->content);
              sVar6 = strlen((char *)fileinfo.__glibc_reserved[2]);
              pcVar4 = (char *)realloc(pcVar4,sVar5 + sVar6 + 1);
              (*part)->content = pcVar4;
              for (blocksout = 0; sVar5 = strlen((char *)fileinfo.__glibc_reserved[2]),
                  (ulong)(long)blocksout < sVar5; blocksout = blocksout + 1) {
                (*part)->content[_uStack_dc] = *(char *)(fileinfo.__glibc_reserved[2] + blocksout);
                _uStack_dc = _uStack_dc + 1;
              }
              (*part)->content[_uStack_dc] = '\0';
            }
            stack0xffffffffffffff28 = 0;
          }
        }
        iVar2 = fclose(__stream);
        if (iVar2 != 0) {
          perror("libcmime: error closing file");
        }
        part_local._4_4_ = 0;
      }
    }
    else {
      part_local._4_4_ = -2;
    }
  }
  else {
    part_local._4_4_ = -1;
  }
  return part_local._4_4_;
}

Assistant:

int cmime_part_from_file(CMimePart_T **part, char *filename, const char *nl) {
    struct stat fileinfo;
    int retval = 0;
    FILE *fp = NULL;
    int encode = 0;
    int i = 0;
    int len = 0;
    int blocksout = 0;
    int pos = 0;
    unsigned char in[3], out[4];
    char *ptemp = NULL;
    CMimeInfo_T *mi = NULL;

    assert((*part));
    assert(filename);

    /* only regular files please */
    retval = stat(filename,&fileinfo);
    if (retval == 0) {
        if(S_ISREG(fileinfo.st_mode)) {
            if (nl == NULL) 
                nl = _cmime_internal_determine_linebreak_from_file(filename);
            
            mi = cmime_util_info_get_from_file(filename);
            if (strcmp(mi->mime_encoding,"binary")==0) 
                asprintf(&ptemp,"%s;%s\tname=%s%s",mi->mime_type,nl,basename(filename),nl);
            else 
                asprintf(&ptemp,"%s;%s\tcharset=%s%s",mi->mime_type,nl,mi->mime_encoding,nl);
            
            cmime_util_info_free(mi);
            cmime_part_set_content_type((*part),ptemp);
            encode = (strncmp(ptemp,MIMETYPE_TEXT_PLAIN,strlen(MIMETYPE_TEXT_PLAIN)) == 0) ? 0 : 1;
            
                    
            if (encode == 1) {
                free(ptemp);
                asprintf(&ptemp,"base64%s",nl);
            } else {
                if (strstr(ptemp,"ascii")!=NULL) {
                    free(ptemp);
                    asprintf(&ptemp,"7bit%s",nl);
                } else {
                    free(ptemp);
                    asprintf(&ptemp,"8bit%s",nl);
                }
            }

            cmime_part_set_content_transfer_encoding((*part),ptemp);
            free(ptemp);
            
            asprintf(&ptemp,"attachment;%s\tfilename=%s%s",nl,basename(filename),nl);
            cmime_part_set_content_disposition((*part),ptemp);      
            free(ptemp);
            
            fp = fopen(filename, "rb");
            if (fp != NULL) {
                (*part)->content = (char *)calloc(1,sizeof(char));
                while(!feof(fp)) {
                    len = 0;
                    
                    for(i=0; i<3; i++) {
                        in[i] = (unsigned char)fgetc(fp);

                        if(!feof(fp)) {
                            len++;
                        } else {
                            in[i] = 0;
                        }
                    }

                    if (len) {
                        if (encode == 0) {
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(in) + sizeof(char) +1);
                            for(i=0; i<3; i++) {
                                (*part)->content[pos++] = in[i];    
                            }
                            (*part)->content[pos] = '\0';
                        } else {
                            cmime_base64_encode_block(in,out,len);
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(out) + sizeof(char) + 1);
                            for (i=0; i<4;i++) {
                                (*part)->content[pos++] = out[i];
                            }
                            (*part)->content[pos] = '\0';                       
                        }
                        blocksout++;
                    }

                    if(blocksout >= (LINE_LENGTH / 4) || feof(fp)) {
                        if(blocksout && (encode == 1)) {
                            /* if base64 data, we need to do a line break after LINE_LENGTH chars */
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + strlen(nl) + sizeof(char));
                            
                            for (i=0; i<strlen(nl);i++) {
                                (*part)->content[pos++] = nl[i];    
                            }
                            (*part)->content[pos] = '\0';
                        }
                    blocksout = 0;
                    } 
                }
                if (fclose(fp)!=0)
                    perror("libcmime: error closing file");
            } else {
                perror("libcmime: error opening file");
                return (-3); /* failed to open file */
            }           
        } else {
            return(-2); /* not regular file */
        } 
    } else {
        return(-1); /* stat error */
    }
    
    return(0);
}